

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::converter::ProtoWriter::ValidOneof
          (ProtoWriter *this,Field *field,StringPiece unnormalized_name)

{
  ProtoElement *this_00;
  bool bVar1;
  Type *pTVar2;
  stringpiece_ssize_type sVar3;
  bool bVar4;
  StringPiece value;
  AlphaNum *in_stack_fffffffffffffea8;
  char *local_150;
  undefined8 local_148;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  StringPiece local_40;
  
  this_00 = (this->element_)._M_t.
            super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
            .
            super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
            ._M_head_impl;
  bVar4 = true;
  if ((this_00 != (ProtoElement *)0x0) && (0 < field->oneof_index_)) {
    bVar1 = ProtoElement::IsOneofIndexTaken(this_00,field->oneof_index_);
    if (bVar1) {
      StringPiece::StringPiece(&local_40,"oneof");
      local_150 = "oneof field \'";
      local_148 = 0xd;
      pTVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(((this->element_)._M_t.
                             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                             .
                             super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                            ._M_head_impl)->type_->oneofs_).super_RepeatedPtrFieldBase,
                          field->oneof_index_ + -1);
      local_120.piece_data_ = (pTVar2->_M_dataplus)._M_p;
      local_120.piece_size_ = pTVar2->_M_string_length;
      local_f0.piece_data_ = "\' is already set. Cannot set \'";
      local_f0.piece_size_ = 0x1e;
      local_90.piece_data_ = "\'";
      local_90.piece_size_ = 1;
      local_c0.piece_data_ = unnormalized_name.ptr_;
      local_c0.piece_size_ = unnormalized_name.length_;
      StrCat_abi_cxx11_(&local_60,(protobuf *)&local_150,&local_120,&local_f0,&local_c0,&local_90,
                        in_stack_fffffffffffffea8);
      sVar3 = StringPiece::CheckedSsizeTFromSizeT(local_60._M_string_length);
      value.length_ = sVar3;
      value.ptr_ = local_60._M_dataplus._M_p;
      InvalidValue(this,local_40,value);
      std::__cxx11::string::~string((string *)&local_60);
      bVar4 = false;
    }
    else {
      ProtoElement::TakeOneofIndex
                ((this->element_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                 ._M_head_impl,field->oneof_index_);
    }
  }
  return bVar4;
}

Assistant:

bool ProtoWriter::ValidOneof(const google::protobuf::Field& field,
                             StringPiece unnormalized_name) {
  if (element_ == nullptr) return true;

  if (field.oneof_index() > 0) {
    if (element_->IsOneofIndexTaken(field.oneof_index())) {
      InvalidValue(
          "oneof",
          StrCat(
              "oneof field '", element_->type().oneofs(field.oneof_index() - 1),
              "' is already set. Cannot set '", unnormalized_name, "'"));
      return false;
    }
    element_->TakeOneofIndex(field.oneof_index());
  }
  return true;
}